

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_1,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *y,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  VarStatus VVar4;
  pointer pnVar5;
  pointer pnVar6;
  byte bVar7;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar8;
  type_conflict5 tVar9;
  VarStatus *pVVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar11;
  long lVar12;
  int k;
  long lVar13;
  int k_1;
  ulong uVar14;
  int local_7c;
  cpp_dec_float<50U,_int,_void> local_78;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  cpp_dec_float<50U,_int,_void> *local_38;
  
  local_40 = y;
  if (this->m_isLast == true) {
    uVar14 = (ulong)(uint)(this->m_perm).thesize;
    lVar13 = uVar14 * 0x38;
    for (; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
      lVar12 = (long)(this->m_perm).data[uVar14 - 1];
      if (-1 < lVar12) {
        pnVar5 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar5[-1].m_backend.data + lVar13),
                   &pnVar5[lVar12].m_backend);
        pnVar5 = (local_40->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar5[-1].m_backend.data + lVar13),
                   &pnVar5[lVar12].m_backend);
        rStatus->data[uVar14 - 1] = rStatus->data[lVar12];
      }
      lVar13 = lVar13 + -0x38;
    }
  }
  lVar12 = 0;
  for (lVar13 = 0;
      uVar14 = (ulong)(this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, lVar13 < (long)uVar14; lVar13 = lVar13 + 1) {
    pNVar11 = (this->m_scale).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    if (*(int *)((long)(&pNVar11->val + 1) + lVar12) != this->m_i) {
      local_78.fpclass = cpp_dec_float_finite;
      local_78.prec_elem = 10;
      local_78.data._M_elems[0] = 0;
      local_78.data._M_elems[1] = 0;
      local_78.data._M_elems[2] = 0;
      local_78.data._M_elems[3] = 0;
      local_78.data._M_elems[4] = 0;
      local_78.data._M_elems[5] = 0;
      local_78.data._M_elems._24_5_ = 0;
      local_78.data._M_elems[7]._1_3_ = 0;
      local_78.data._M_elems._32_5_ = 0;
      local_78.data._M_elems[9]._1_3_ = 0;
      local_78.exp = 0;
      local_78.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_78,
                 &(s->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)(pNVar11->val).m_backend.data._M_elems + lVar12));
      iVar2 = *(int *)((long)(&((this->m_scale).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val + 1) + lVar12);
      pnVar6 = (s->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar6[iVar2].m_backend.data + 0x20) =
           CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar6[iVar2].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_78.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
      pnVar5 = pnVar6 + iVar2;
      (pnVar5->m_backend).data._M_elems[0] = local_78.data._M_elems[0];
      *(uint *)((long)&(pnVar5->m_backend).data + 4) = local_78.data._M_elems[1];
      *(uint *)((long)&(pnVar5->m_backend).data + 8) = local_78.data._M_elems[2];
      *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = local_78.data._M_elems[3];
      pnVar6[iVar2].m_backend.exp = local_78.exp;
      pnVar6[iVar2].m_backend.neg = local_78.neg;
      pnVar6[iVar2].m_backend.fpclass = local_78.fpclass;
      pnVar6[iVar2].m_backend.prec_elem = local_78.prec_elem;
    }
    lVar12 = lVar12 + 0x3c;
  }
  local_38 = &(this->m_i_rowObj).m_backend;
  lVar12 = 0;
  lVar13 = 0;
  bVar7 = 0;
  do {
    pVVar8 = local_40;
    if ((int)uVar14 <= lVar13) {
      return;
    }
    pNVar11 = (this->m_scale).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    iVar2 = *(int *)((long)(&pNVar11->val + 1) + lVar12);
    iVar3 = this->m_i;
    VVar4 = rStatus->data[iVar3];
    if ((VVar4 == BASIC) || ((bool)(iVar2 != iVar3 & bVar7))) {
LAB_0027f477:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(local_40->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)(((this->m_rowObj).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem)->val).m_backend.data._M_elems + lVar12));
      pVVar10 = rStatus->data + iVar2;
LAB_0027f49a:
      *pVVar10 = BASIC;
    }
    else if (VVar4 == FIXED) {
      if ((iVar2 == this->m_maxLhsIdx) || (iVar2 == this->m_minRhsIdx)) {
        local_78.fpclass = cpp_dec_float_finite;
        local_78.prec_elem = 10;
        local_78.data._M_elems[0] = 0;
        local_78.data._M_elems[1] = 0;
        local_78.data._M_elems[2] = 0;
        local_78.data._M_elems[3] = 0;
        local_78.data._M_elems[4] = 0;
        local_78.data._M_elems[5] = 0;
        local_78.data._M_elems._24_5_ = 0;
        local_78.data._M_elems[7]._1_3_ = 0;
        local_78.data._M_elems._32_5_ = 0;
        local_78.data._M_elems[9]._1_3_ = 0;
        local_78.exp = 0;
        local_78.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_78,
                   &(local_40->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar11->val).m_backend.data._M_elems + lVar12));
        pnVar5 = (pVVar8->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar5[iVar2].m_backend.data + 0x20) =
             CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
        puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_78.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
        *(undefined8 *)&pnVar5[iVar2].m_backend.data = local_78.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8) = local_78.data._M_elems._8_8_;
        pnVar5[iVar2].m_backend.exp = local_78.exp;
        pnVar5[iVar2].m_backend.neg = local_78.neg;
        pnVar5[iVar2].m_backend.fpclass = local_78.fpclass;
        pnVar5[iVar2].m_backend.prec_elem = local_78.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(pVVar8->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,local_38);
        if ((this->m_isLhsEqualRhs).data[lVar13] != true) {
          if (iVar2 != this->m_maxLhsIdx) {
            pNVar11 = (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            goto LAB_0027f7cf;
          }
          pNVar11 = (this->m_scale).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          goto LAB_0027f5ab;
        }
        pVVar10 = rStatus->data;
        pVVar10[iVar2] = FIXED;
        goto LAB_0027f7f6;
      }
LAB_0027f4ce:
      if (iVar2 != iVar3) goto LAB_0027f477;
    }
    else {
      if ((VVar4 == ON_LOWER) && (iVar2 == this->m_maxLhsIdx)) {
        local_78.fpclass = cpp_dec_float_finite;
        local_78.prec_elem = 10;
        local_78.data._M_elems[0] = 0;
        local_78.data._M_elems[1] = 0;
        local_78.data._M_elems[2] = 0;
        local_78.data._M_elems[3] = 0;
        local_78.data._M_elems[4] = 0;
        local_78.data._M_elems[5] = 0;
        local_78.data._M_elems._24_5_ = 0;
        local_78.data._M_elems[7]._1_3_ = 0;
        local_78.data._M_elems._32_5_ = 0;
        local_78.data._M_elems[9]._1_3_ = 0;
        local_78.exp = 0;
        local_78.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_78,
                   &(local_40->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar11->val).m_backend.data._M_elems + lVar12));
        pnVar5 = (pVVar8->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar5[iVar2].m_backend.data + 0x20) =
             CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
        puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_78.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
        *(undefined8 *)&pnVar5[iVar2].m_backend.data = local_78.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8) = local_78.data._M_elems._8_8_;
        pnVar5[iVar2].m_backend.exp = local_78.exp;
        pnVar5[iVar2].m_backend.neg = local_78.neg;
        pnVar5[iVar2].m_backend.fpclass = local_78.fpclass;
        pnVar5[iVar2].m_backend.prec_elem = local_78.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(pVVar8->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,local_38);
        pNVar11 = (this->m_scale).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
LAB_0027f5ab:
        local_78.neg = false;
        local_78.exp = 0;
        local_78.data._M_elems[9]._1_3_ = 0;
        local_78.data._M_elems._32_5_ = 0;
        local_78.data._M_elems[7]._1_3_ = 0;
        local_78.data._M_elems._24_5_ = 0;
        local_78.fpclass = cpp_dec_float_finite;
        local_78.prec_elem = 10;
        local_78.data._M_elems[4] = 0;
        local_78.data._M_elems[5] = 0;
        local_78.data._M_elems[2] = 0;
        local_78.data._M_elems[3] = 0;
        local_78.data._M_elems[0] = 0;
        local_78.data._M_elems[1] = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_78,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar11->val).m_backend.data._M_elems + lVar12),
                   (cpp_dec_float<50U,_int,_void> *)pNVar11);
        local_7c = 0;
        tVar9 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_78,&local_7c);
      }
      else {
        if ((VVar4 != ON_UPPER) || (iVar2 != this->m_minRhsIdx)) goto LAB_0027f4ce;
        local_78.fpclass = cpp_dec_float_finite;
        local_78.prec_elem = 10;
        local_78.data._M_elems[0] = 0;
        local_78.data._M_elems[1] = 0;
        local_78.data._M_elems[2] = 0;
        local_78.data._M_elems[3] = 0;
        local_78.data._M_elems[4] = 0;
        local_78.data._M_elems[5] = 0;
        local_78.data._M_elems._24_5_ = 0;
        local_78.data._M_elems[7]._1_3_ = 0;
        local_78.data._M_elems._32_5_ = 0;
        local_78.data._M_elems[9]._1_3_ = 0;
        local_78.exp = 0;
        local_78.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_78,
                   &(local_40->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar11->val).m_backend.data._M_elems + lVar12));
        pnVar5 = (pVVar8->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar5[iVar2].m_backend.data + 0x20) =
             CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
        puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_78.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
        *(undefined8 *)&pnVar5[iVar2].m_backend.data = local_78.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8) = local_78.data._M_elems._8_8_;
        pnVar5[iVar2].m_backend.exp = local_78.exp;
        pnVar5[iVar2].m_backend.neg = local_78.neg;
        pnVar5[iVar2].m_backend.fpclass = local_78.fpclass;
        pnVar5[iVar2].m_backend.prec_elem = local_78.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(pVVar8->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,local_38);
        pNVar11 = (this->m_scale).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
LAB_0027f7cf:
        local_78.fpclass = cpp_dec_float_finite;
        local_78.prec_elem = 10;
        local_78.neg = false;
        local_78.exp = 0;
        local_78.data._M_elems[9]._1_3_ = 0;
        local_78.data._M_elems._32_5_ = 0;
        local_78.data._M_elems[7]._1_3_ = 0;
        local_78.data._M_elems._24_5_ = 0;
        local_78.data._M_elems[4] = 0;
        local_78.data._M_elems[5] = 0;
        local_78.data._M_elems[2] = 0;
        local_78.data._M_elems[3] = 0;
        local_78.data._M_elems[0] = 0;
        local_78.data._M_elems[1] = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_78,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar11->val).m_backend.data._M_elems + lVar12),
                   (cpp_dec_float<50U,_int,_void> *)pNVar11);
        local_7c = 0;
        tVar9 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_78,&local_7c);
        tVar9 = !tVar9;
      }
      pVVar10 = rStatus->data;
      pVVar10[iVar2] = (uint)tVar9;
LAB_0027f7f6:
      bVar7 = 1;
      if (iVar2 != this->m_i) {
        pVVar10 = pVVar10 + this->m_i;
        bVar7 = 1;
        goto LAB_0027f49a;
      }
    }
    lVar13 = lVar13 + 1;
    uVar14 = (ulong)(uint)(this->m_scale).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
    lVar12 = lVar12 + 0x3c;
  } while( true );
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}